

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

optional<supermap::KeyValue<char,_char>_> __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>::find
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char> *this,
          char *pattern,function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *less,
          function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *equal)

{
  bool bVar1;
  uint3 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  uint uVar9;
  KeyValue<char,_char> middleElem;
  KeyValue<char,_char> firstLeqElem;
  KeyValue<char,_char> local_44;
  KeyValue<char,_char> local_42;
  function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *local_40;
  function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *local_38;
  
  local_40 = equal;
  local_38 = less;
  iVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
            super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
            super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage[1]
          )();
  uVar6 = (uint)equal;
  if ((char)iVar3 != '\0') {
    uVar4 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage
              [1])(this);
    uVar8 = extraout_RDX;
    uVar5 = 0;
    while( true ) {
      uVar9 = (uint)(char)uVar5;
      uVar6 = (int)(char)uVar4 - uVar9;
      if ((int)uVar6 < 2) break;
      uVar6 = (int)(char)uVar4 + uVar9;
      uVar6 = (uint)(ushort)((short)uVar6 >> 0xf) << 0x10 | uVar6 & 0xffff;
      uVar7 = (int)uVar6 / 2;
      uVar5 = uVar7 & 0xffff;
      iVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
                super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                _vptr_OrderedStorage[4])
                        (this,(ulong)(uint)(int)(char)uVar5,
                         CONCAT62((int6)((ulong)uVar8 >> 0x10),(short)((int)uVar6 % 2)));
      local_44 = SUB42(iVar3,0);
      bVar1 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::operator()
                        (local_38,&local_44,pattern);
      uVar8 = extraout_RDX_00;
      if (!bVar1) {
        bVar1 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::
                operator()(local_40,&local_44,pattern);
        uVar6 = uVar4 & 0xff;
        uVar7 = uVar7 & 0xff;
        uVar8 = extraout_RDX_01;
        uVar4 = uVar7;
        uVar5 = uVar9;
        if (bVar1) {
          uVar4 = uVar6;
          uVar5 = uVar7;
        }
      }
    }
    iVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
              super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage
              [1])(this);
    if ((char)uVar5 < (char)iVar3) {
      iVar3 = (*(this->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
                super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                _vptr_OrderedStorage[4])(this,(ulong)uVar9);
      local_42 = SUB42(iVar3,0);
      bVar1 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::operator()
                        (local_40,&local_42,pattern);
      uVar2 = (uint3)bVar1;
      uVar6 = (uint)(ushort)local_42;
      goto LAB_00138ecd;
    }
  }
  uVar2 = 0;
LAB_00138ecd:
  return (_Optional_base<supermap::KeyValue<char,_char>,_true,_true>)
         ((uint3)uVar6 & 0xffff | uVar2 << 0x10);
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }